

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawTableCellBorder
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,QTextTable *table,
          QTextTableData *td,QTextTableCell *cell)

{
  double dVar1;
  QTextDocument *pQVar2;
  qreal qVar3;
  qreal qVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  RenderHints RVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  long in_FS_OFFSET;
  bool bVar20;
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 auVar23 [16];
  QSizeF QVar24;
  double local_140;
  QRectF local_d8;
  QTextTableCell local_b0;
  QRectF local_a0;
  BorderPaginator local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (td->super_QTextFrameData).border.val + (td->cellSpacing).val;
  local_140 = (double)((td->super_QTextFrameData).effectiveTopMargin.val + iVar5) * 0.015625;
  iVar9 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  QTextTable::format((QTextTable *)&local_80);
  iVar6 = QTextFormat::intProperty((QTextFormat *)&local_80,0x4104);
  iVar7 = QTextTable::rows(table);
  iVar22 = iVar7 + -1;
  if (iVar6 < iVar7 + -1) {
    iVar22 = iVar6;
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_80);
  if ((0 < iVar22) && (iVar6 = QTextTableCell::row(cell), iVar22 <= iVar6)) {
    local_140 = local_140 + (double)(td->headerHeight).val * 0.015625;
  }
  QVar24 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  auVar21._0_8_ = QVar24.ht;
  iVar22 = 0;
  iVar6 = 0;
  if (0.0 < auVar21._0_8_) {
    auVar23._8_8_ = cellRect->h + cellRect->yp + 0.0;
    auVar23._0_8_ = cellRect->yp;
    auVar21._8_8_ = auVar21._0_8_;
    auVar23 = divpd(auVar23,auVar21);
    iVar22 = (int)auVar23._0_8_;
    iVar6 = (int)auVar23._8_8_;
  }
  local_80.rect.xp = cellRect->xp;
  local_80.rect.yp = cellRect->yp;
  local_80.rect.w = cellRect->w;
  local_80.rect.h = cellRect->h;
  local_80.topMarginAfterPageBreak = local_140;
  local_80.border = 0.0;
  local_80.pageHeight = auVar21._0_8_;
  local_80.bottomMargin = (double)(iVar5 + iVar9) * 0.015625;
  local_80.topPage = iVar22;
  local_80.bottomPage = iVar6;
  RVar8 = QPainter::renderHints(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  if (iVar22 <= iVar6) {
    do {
      local_d8.w._0_4_ = 0xffffffff;
      local_d8.w._4_4_ = 0xffffffff;
      local_d8.h._0_4_ = 0xffffffff;
      local_d8.h._4_4_ = 0xffffffff;
      local_d8.xp._0_4_ = 0xffffffff;
      local_d8.xp._4_4_ = 0xffffffff;
      local_d8.yp._0_4_ = 0xffffffff;
      local_d8.yp._4_4_ = 0xffffffff;
      BorderPaginator::clipRect(&local_d8,&local_80,iVar22);
      if ((0.0 < (double)CONCAT44(local_d8.w._4_4_,local_d8.w._0_4_)) &&
         (0.0 < (double)CONCAT44(local_d8.h._4_4_,local_d8.h._0_4_))) {
        dVar1 = cellRect->yp;
        iVar9 = QTextTableCell::row(cell);
        dVar1 = (double)(td->rowPositions).d.ptr[iVar9].val * -0.015625 + dVar1;
        QTextTable::format((QTextTable *)&local_a0);
        iVar9 = QTextFormat::intProperty((QTextFormat *)&local_a0,0x4104);
        QTextFormat::~QTextFormat((QTextFormat *)&local_a0);
        QTextTable::format((QTextTable *)&local_a0);
        iVar5 = QTextFormat::intProperty((QTextFormat *)&local_a0,0x4104);
        QTextFormat::~QTextFormat((QTextFormat *)&local_a0);
        iVar6 = QTextTableCell::row(cell);
        QTextTable::format((QTextTable *)&local_a0);
        iVar7 = QTextFormat::intProperty((QTextFormat *)&local_a0,0x4104);
        QTextFormat::~QTextFormat((QTextFormat *)&local_a0);
        iVar10 = QTextTableCell::row(cell);
        iVar11 = QTextTableCell::row(cell);
        iVar12 = QTextTableCell::rowSpan(cell);
        iVar13 = QTextTable::rows(table);
        bVar19 = false;
        if ((iVar7 <= iVar6) && (bVar19 = false, iVar10 != iVar9)) {
          pQVar2 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
          iVar10 = QTextTableCell::column(cell);
          iVar14 = QTextTableCell::row(cell);
          if (((iVar14 < 1 || iVar10 < 0) || (iVar15 = QTextTable::columns(table), iVar15 <= iVar10)
              ) || (iVar10 = QTextTable::rows(table), iVar10 < iVar14)) {
            local_b0.table = (QTextTable *)0x0;
          }
          else {
            iVar10 = QTextTableCell::row(cell);
            QTextTableCell::column(cell);
            QTextTable::cellAt((QTextTable *)&local_b0,(int)table,iVar10 + -1);
          }
          QTextTableData::cellRect(&local_a0,td,&local_b0);
          qVar4 = local_a0.h;
          qVar3 = local_a0.yp;
          QVar24 = QTextDocument::pageSize(pQVar2);
          iVar10 = 0;
          if (0.0 < QVar24.ht) {
            iVar10 = (int)((qVar3 + dVar1 + qVar4 + 0.0) / QVar24.ht);
          }
          bVar19 = iVar10 < iVar22;
        }
        if (iVar12 + iVar11 < iVar13) {
          pQVar2 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
          iVar10 = QTextTableCell::rowSpan(cell);
          uVar16 = QTextTableCell::column(cell);
          iVar11 = QTextTableCell::row(cell);
          if ((((int)(uVar16 | iVar11 + iVar10) < 0) ||
              (iVar12 = QTextTable::columns(table), iVar12 <= (int)uVar16)) ||
             (iVar12 = QTextTable::rows(table), iVar12 <= iVar11 + iVar10)) {
            local_b0.table = (QTextTable *)0x0;
          }
          else {
            iVar11 = QTextTableCell::row(cell);
            QTextTableCell::column(cell);
            QTextTable::cellAt((QTextTable *)&local_b0,(int)table,iVar10 + iVar11);
          }
          QTextTableData::cellRect(&local_a0,td,&local_b0);
          dVar1 = dVar1 + local_a0.yp;
          QVar24 = QTextDocument::pageSize(pQVar2);
          iVar10 = (int)(dVar1 / QVar24.ht);
          if (QVar24.ht <= 0.0) {
            iVar10 = 0;
          }
          bVar18 = iVar22 < iVar10;
        }
        else {
          bVar18 = false;
        }
        iVar9 = iVar9 + -1;
        bVar20 = iVar22 != local_80.bottomPage;
        bVar17 = iVar22 == local_80.topPage & bVar19;
        bVar19 = (bool)(iVar5 < 1 & bVar17);
        if (td->borderCollapse == true) {
          bVar20 = (bool)((iVar22 != local_80.bottomPage | bVar18) & iVar7 <= iVar6);
          bVar18 = iVar5 < 1 && iVar22 != local_80.topPage;
          if ((iVar6 < iVar7) || (iVar22 == local_80.topPage && (0 < iVar5 & bVar17) == 0)) {
LAB_004e5207:
            drawCellBorder(this,painter,table,td,cell,&local_d8,TopEdge,-1,true,true,bVar19);
            iVar9 = -1;
          }
        }
        else {
          bVar18 = true;
          if (iVar22 == local_80.topPage) {
            bVar18 = false;
            goto LAB_004e5207;
          }
        }
        drawCellBorder(this,painter,table,td,cell,&local_d8,LeftEdge,iVar9,(bool)(bVar18 ^ 1U),
                       (bool)(bVar20 ^ 1U),bVar19);
        drawCellBorder(this,painter,table,td,cell,&local_d8,RightEdge,iVar9,(bool)(bVar18 ^ 1U),
                       (bool)(bVar20 ^ 1U),bVar19);
        if (bVar20 == false) {
          drawCellBorder(this,painter,table,td,cell,&local_d8,BottomEdge,-1,true,true,false);
        }
      }
      bVar19 = iVar22 < local_80.bottomPage;
      iVar22 = iVar22 + 1;
    } while (bVar19);
  }
  if (((uint)RVar8.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
             super_QFlagsStorage<QPainter::RenderHint>.i & 1) == 0) {
    QPainter::setRenderHint(painter,Antialiasing,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCellBorder(const QRectF &cellRect, QPainter *painter,
                                                     QTextTable *table, QTextTableData *td,
                                                     const QTextTableCell &cell) const
{
#ifndef QT_NO_CSSPARSER
    qreal topMarginAfterPageBreak = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (headerRowCount > 0 && cell.row() >= headerRowCount)
        topMarginAfterPageBreak += td->headerHeight.toReal();

    BorderPaginator paginator(document, cellRect, topMarginAfterPageBreak, bottomMargin, 0);

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    // paint cell borders for every page the cell appears on
    for (int page = paginator.topPage; page <= paginator.bottomPage; ++page) {
        const QRectF clipped = paginator.clipRect(page);
        if (!clipped.isValid())
            continue;

        const qreal offset = cellRect.top() - td->rowPositions.at(cell.row()).toReal();
        const int lastHeaderRow = table->format().headerRowCount() - 1;
        const bool tableHasHeader = table->format().headerRowCount() > 0;
        const bool isHeaderRow = cell.row() < table->format().headerRowCount();
        const bool isFirstRow = cell.row() == lastHeaderRow + 1;
        const bool isLastRow = cell.row() + cell.rowSpan() >= table->rows();
        const bool previousRowOnPreviousPage = !isFirstRow
                && !isHeaderRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::TopEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).bottomPage < page;
        const bool nextRowOnNextPage = !isLastRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::BottomEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).topPage > page;
        const bool rowStartsOnPage = page == paginator.topPage;
        const bool rowEndsOnPage = page == paginator.bottomPage;
        const bool rowStartsOnPageTop = !tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;
        const bool rowStartsOnPageBelowHeader = tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;

        const bool suppressTopBorder = td->borderCollapse
                ? !isHeaderRow && (!rowStartsOnPage || rowStartsOnPageBelowHeader)
                : !rowStartsOnPage;
        const bool suppressBottomBorder = td->borderCollapse
                ? !isHeaderRow && (!rowEndsOnPage || nextRowOnNextPage)
                : !rowEndsOnPage;
        const bool doNotAdjustTopAnchor = td->borderCollapse
                ? !tableHasHeader && !rowStartsOnPage
                : !rowStartsOnPage;
        const bool doNotAdjustBottomAnchor = suppressBottomBorder;

        if (!suppressTopBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::TopEdge,
                           -1, true, true, rowStartsOnPageTop);
        }

        drawCellBorder(this, painter, table, td, cell, clipped, QCss::LeftEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);
        drawCellBorder(this, painter, table, td, cell, clipped, QCss::RightEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);

        if (!suppressBottomBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::BottomEdge,
                           -1, true, true, false);
        }
    }

    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
#else
    Q_UNUSED(cell);
    Q_UNUSED(cellRect);
    Q_UNUSED(painter);
    Q_UNUSED(table);
    Q_UNUSED(td);
    Q_UNUSED(cell);
#endif
}